

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O2

vector_type * __thiscall
Disa::Vector_Dense<double,_0UL>::operator*=(Vector_Dense<double,_0UL> *this,double *scalar)

{
  double *pdVar1;
  Vector_Dense<double,_0UL> *__range2;
  double *element;
  double *pdVar2;
  
  __range2 = this;
  pdVar1 = (this->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar2 = (this->super_vector<double,_std::allocator<double>_>).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    *pdVar2 = *scalar * *pdVar2;
  }
  return __range2;
}

Assistant:

vector_type& operator*=(const _type& scalar) {
    FOR_EACH_REF(element, *this) element *= scalar;
    return *this;
  }